

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void place_desc_message(WINDOW *win,wchar_t *x,wchar_t *y,char *b)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  
  if ((y != (wchar_t *)0x0) && ((char)*y != '\0')) {
    *(undefined1 *)((long)y + 0x4e) = 0;
    sVar4 = strlen((char *)y);
    if ((0x27 < sVar4) && (iVar3._0_2_ = win->_cury, iVar3._2_2_ = win->_curx, 0x27 < iVar3)) {
      *x = *x + L'\x01';
      win->_cury = 0;
      win->_curx = 0;
    }
    if ((*x < L'\x02') &&
       (uVar1._0_2_ = win->_cury, uVar1._2_2_ = win->_curx, iVar3 = wmove(statuswin,*x,uVar1),
       iVar3 != -1)) {
      waddnstr(statuswin,y,0xffffffff);
    }
    sVar4 = strlen((char *)y);
    iVar3 = 0x28;
    if (0x25 < sVar4) {
      iVar3 = 0x50;
    }
    iVar2 = *(int *)win;
    *(int *)win = iVar3 + iVar2;
    if (0x28 < iVar3 + iVar2) {
      *x = *x + L'\x01';
      win->_cury = 0;
      win->_curx = 0;
    }
  }
  return;
}

Assistant:

static void place_desc_message(WINDOW *win, int *x, int *y, char *b)
{
    if (!b || !*b)
	return;

    /* Arrange description messages aligned to 40-character columns,
     * accounting for overflow if needed. */
    b[78] = '\0';
    if (strlen(b) >= 40 && *x >= 40) { (*y)++; *x = 0; }
    if (*y <= 1) mvwaddstr(statuswin, *y, *x, b);
    (*x) += (strlen(b) >= 38 ? 80 : 40);
    if (*x > 40) { (*y)++; *x = 0; }
}